

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
PS2KeyboardSimulationDataGenerator::SendExtendedKey
          (PS2KeyboardSimulationDataGenerator *this,U8 keycode)

{
  U8 keycode_local;
  PS2KeyboardSimulationDataGenerator *this_local;
  
  SendByte(this,0xe0);
  SendByte(this,keycode);
  SendByte(this,0xe0);
  SendByte(this,0xf0);
  SendByte(this,keycode);
  return;
}

Assistant:

void PS2KeyboardSimulationDataGenerator::SendExtendedKey( U8 keycode )
{
    // Make
    SendByte( 0xE0 );
    SendByte( keycode );

    // break
    SendByte( 0xE0 );
    SendByte( 0xF0 );
    SendByte( keycode );
}